

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemToolsStatic::FileIsFullPath(char *in_name,size_t len)

{
  size_t len_local;
  char *in_name_local;
  
  if (len == 0) {
    in_name_local._7_1_ = false;
  }
  else if (*in_name == '~') {
    in_name_local._7_1_ = true;
  }
  else if (*in_name == '/') {
    in_name_local._7_1_ = true;
  }
  else {
    in_name_local._7_1_ = false;
  }
  return in_name_local._7_1_;
}

Assistant:

bool SystemToolsStatic::FileIsFullPath(const char* in_name, size_t len)
{
#if defined(_WIN32) || defined(__CYGWIN__)
  // On Windows, the name must be at least two characters long.
  if (len < 2) {
    return false;
  }
  if (in_name[1] == ':') {
    return true;
  }
  if (in_name[0] == '\\') {
    return true;
  }
#else
  // On UNIX, the name must be at least one character long.
  if (len < 1) {
    return false;
  }
#endif
#if !defined(_WIN32)
  if (in_name[0] == '~') {
    return true;
  }
#endif
  // On UNIX, the name must begin in a '/'.
  // On Windows, if the name begins in a '/', then it is a full
  // network path.
  if (in_name[0] == '/') {
    return true;
  }
  return false;
}